

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InnerObjectFormats.cpp
# Opt level: O0

void __thiscall jbcoin::InnerObjectFormats::InnerObjectFormats(InnerObjectFormats *this)

{
  int iVar1;
  char *pcVar2;
  Item *pIVar3;
  SOElement local_70;
  SOElement local_60;
  SOElement local_50;
  SOElement local_40;
  SOElement local_30 [2];
  InnerObjectFormats *local_10;
  InnerObjectFormats *this_local;
  
  local_10 = this;
  KnownFormats<int>::KnownFormats(&this->super_KnownFormats<int>);
  (this->super_KnownFormats<int>)._vptr_KnownFormats = (_func_int **)&PTR_addCommonFields_0051a108;
  SField::getJsonName_abi_cxx11_((SField *)sfSignerEntry);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = SField::getCode((SField *)sfSignerEntry);
  pIVar3 = KnownFormats<int>::add(&this->super_KnownFormats<int>,pcVar2,iVar1);
  SOElement::SOElement(local_30,(SField *)sfAccount,SOE_REQUIRED);
  pIVar3 = KnownFormats<int>::Item::operator<<(pIVar3,local_30);
  SOElement::SOElement(&local_40,(SField *)sfSignerWeight,SOE_REQUIRED);
  KnownFormats<int>::Item::operator<<(pIVar3,&local_40);
  SField::getJsonName_abi_cxx11_((SField *)sfSigner);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = SField::getCode((SField *)sfSigner);
  pIVar3 = KnownFormats<int>::add(&this->super_KnownFormats<int>,pcVar2,iVar1);
  SOElement::SOElement(&local_50,(SField *)sfAccount,SOE_REQUIRED);
  pIVar3 = KnownFormats<int>::Item::operator<<(pIVar3,&local_50);
  SOElement::SOElement(&local_60,(SField *)sfSigningPubKey,SOE_REQUIRED);
  pIVar3 = KnownFormats<int>::Item::operator<<(pIVar3,&local_60);
  SOElement::SOElement(&local_70,(SField *)sfTxnSignature,SOE_REQUIRED);
  KnownFormats<int>::Item::operator<<(pIVar3,&local_70);
  return;
}

Assistant:

InnerObjectFormats::InnerObjectFormats ()
{
    add (sfSignerEntry.getJsonName ().c_str (), sfSignerEntry.getCode ())
        << SOElement (sfAccount,              SOE_REQUIRED)
        << SOElement (sfSignerWeight,         SOE_REQUIRED)
        ;

    add (sfSigner.getJsonName ().c_str (), sfSigner.getCode ())
        << SOElement (sfAccount,              SOE_REQUIRED)
        << SOElement (sfSigningPubKey,        SOE_REQUIRED)
        << SOElement (sfTxnSignature,         SOE_REQUIRED)
        ;
}